

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeRule
          (cmLocalUnixMakefileGenerator3 *this,ostream *os,char *comment,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *commands,bool symbolic,bool in_help)

{
  cmOutputConverter *this_00;
  cmMakefile *this_01;
  pointer pbVar1;
  string_view sep;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  cmValue cVar5;
  char *pcVar6;
  pointer path;
  string_view prefix;
  string tgt;
  string local_b0;
  string *local_90;
  string replace;
  string local_50;
  
  local_90 = target;
  if (target->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&replace,"No target for WriteMakeRule! called with comment: ",
               (allocator<char> *)&tgt);
    if (comment != (char *)0x0) {
      std::__cxx11::string::append((char *)&replace);
    }
    cmSystemTools::Error(&replace);
  }
  else {
    replace._M_dataplus._M_p = (pointer)&replace.field_2;
    replace._M_string_length = 0;
    replace.field_2._M_local_buf[0] = '\0';
    if (comment != (char *)0x0) {
      std::__cxx11::string::assign((char *)&replace);
      while( true ) {
        lVar3 = std::__cxx11::string::find((char)&replace,10);
        if (lVar3 == -1) break;
        poVar4 = std::operator<<(os,"# ");
        std::__cxx11::string::substr((ulong)&tgt,(ulong)&replace);
        poVar4 = std::operator<<(poVar4,(string *)&tgt);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)&tgt);
      }
      poVar4 = std::operator<<(os,"# ");
      std::__cxx11::string::substr((ulong)&tgt,(ulong)&replace);
      poVar4 = std::operator<<(poVar4,(string *)&tgt);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&tgt);
    }
    this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
    cmOutputConverter::MaybeRelativeToTopBinDir(&local_b0,this_00,local_90);
    ConvertToMakefilePath(&tgt,this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    pcVar6 = "";
    if (tgt._M_string_length == 1) {
      pcVar6 = " ";
    }
    if (symbolic) {
      this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"CMAKE_MAKE_SYMBOLIC_RULE",(allocator<char> *)&local_50);
      cVar5 = cmMakefile::GetDefinition(this_01,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (cVar5.Value != (string *)0x0) {
        poVar4 = std::operator<<(os,(string *)&tgt);
        poVar4 = std::operator<<(poVar4,pcVar6);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)cVar5.Value);
        std::operator<<(poVar4,"\n");
      }
    }
    path = (depends->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (depends->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (path == pbVar1) {
      poVar4 = std::operator<<(os,(string *)&tgt);
      poVar4 = std::operator<<(poVar4,pcVar6);
      std::operator<<(poVar4,":\n");
    }
    else {
      for (; path != pbVar1; path = path + 1) {
        poVar4 = std::operator<<(os,(string *)&tgt);
        poVar4 = std::operator<<(poVar4,pcVar6);
        poVar4 = std::operator<<(poVar4,": ");
        cmOutputConverter::MaybeRelativeToTopBinDir(&local_50,this_00,path);
        ConvertToMakefilePath(&local_b0,this,&local_50);
        poVar4 = std::operator<<(poVar4,(string *)&local_b0);
        std::operator<<(poVar4,'\n');
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    if ((commands->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (commands->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      sep._M_str = "\n";
      sep._M_len = 1;
      prefix._M_str = "\t";
      prefix._M_len = 1;
      cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_b0,prefix,commands,(string_view)(ZEXT816(0x5f8929) << 0x40),sep);
      poVar4 = std::operator<<(os,(string *)&local_b0);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if (symbolic) {
      bVar2 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
      if (!bVar2) {
        poVar4 = std::operator<<(os,".PHONY : ");
        poVar4 = std::operator<<(poVar4,(string *)&tgt);
        std::operator<<(poVar4,"\n");
      }
    }
    std::operator<<(os,"\n");
    if (in_help) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->LocalHelp,local_90);
    }
    std::__cxx11::string::~string((string *)&tgt);
  }
  std::__cxx11::string::~string((string *)&replace);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeRule(
  std::ostream& os, const char* comment, const std::string& target,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands, bool symbolic, bool in_help)
{
  // Make sure there is a target.
  if (target.empty()) {
    std::string err("No target for WriteMakeRule! called with comment: ");
    if (comment) {
      err += comment;
    }
    cmSystemTools::Error(err);
    return;
  }

  std::string replace;

  // Write the comment describing the rule in the makefile.
  if (comment) {
    replace = comment;
    std::string::size_type lpos = 0;
    std::string::size_type rpos;
    while ((rpos = replace.find('\n', lpos)) != std::string::npos) {
      os << "# " << replace.substr(lpos, rpos - lpos) << "\n";
      lpos = rpos + 1;
    }
    os << "# " << replace.substr(lpos) << "\n";
  }

  // Construct the left hand side of the rule.
  std::string tgt =
    this->ConvertToMakefilePath(this->MaybeRelativeToTopBinDir(target));

  const char* space = "";
  if (tgt.size() == 1) {
    // Add a space before the ":" to avoid drive letter confusion on
    // Windows.
    space = " ";
  }

  // Mark the rule as symbolic if requested.
  if (symbolic) {
    if (cmValue sym =
          this->Makefile->GetDefinition("CMAKE_MAKE_SYMBOLIC_RULE")) {
      os << tgt << space << ": " << *sym << "\n";
    }
  }

  // Write the rule.
  if (depends.empty()) {
    // No dependencies.  The commands will always run.
    os << tgt << space << ":\n";
  } else {
    // Split dependencies into multiple rule lines.  This allows for
    // very long dependency lists even on older make implementations.
    for (std::string const& depend : depends) {
      os << tgt << space << ": "
         << this->ConvertToMakefilePath(this->MaybeRelativeToTopBinDir(depend))
         << '\n';
    }
  }

  if (!commands.empty()) {
    // Write the list of commands.
    os << cmWrap("\t", commands, "", "\n") << "\n";
  }
  if (symbolic && !this->IsWatcomWMake()) {
    os << ".PHONY : " << tgt << "\n";
  }
  os << "\n";
  // Add the output to the local help if requested.
  if (in_help) {
    this->LocalHelp.push_back(target);
  }
}